

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O0

void enq(Block *b,ProxyWithLink *cp)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  char *in_RDX;
  ProxyWithLink *in_RSI;
  int *in_RDI;
  int i;
  Link *l;
  int iVar3;
  ProxyWithLink *this;
  BlockID *to;
  
  iVar1 = diy::Master::ProxyWithLink::link(in_RSI,(char *)in_RSI,in_RDX);
  to = (BlockID *)CONCAT44(extraout_var,iVar1);
  iVar1 = 0;
  while( true ) {
    iVar3 = iVar1;
    iVar2 = diy::Link::size((Link *)0x10d7e7);
    if (iVar2 <= iVar1) break;
    this = in_RSI;
    diy::Link::target((Link *)CONCAT44(iVar3,iVar1),(int)((ulong)in_RSI >> 0x20));
    diy::Master::Proxy::enqueue<int>
              (&this->super_Proxy,to,(int *)CONCAT44(iVar3,iVar1),
               (_func_void_BinaryBuffer_ptr_int_ptr *)in_RSI);
    iVar1 = iVar3 + 1;
    in_RSI = this;
  }
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

void enq(Block* b, const diy::Master::ProxyWithLink& cp)
{
    diy::Link* l = cp.link();

    for (int i = 0; i < l->size(); ++i)
        cp.enqueue(l->target(i), b->count);
    b->count++;
}